

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O3

int poly_unmarshal(poly *out,uint8_t *in)

{
  poly *ppVar1;
  short sVar2;
  uint i;
  int iVar3;
  poly *ppVar4;
  long lVar5;
  size_t i_1;
  uint16_t *p;
  
  i_1 = 6;
  ppVar1 = out;
  do {
    ppVar4 = ppVar1;
    (ppVar4->field_0).v[0] = (in[i_1 - 5] & 0x1f) << 8 | (ushort)in[i_1 - 6];
    (ppVar4->field_0).v[1] =
         (in[i_1 - 3] & 3) << 0xb | (ushort)(in[i_1 - 5] >> 5) + (ushort)in[i_1 - 4] * 8;
    (ppVar4->field_0).v[2] = (in[i_1 - 2] & 0x7f) << 6 | (ushort)(in[i_1 - 3] >> 2);
    (ppVar4->field_0).v[3] =
         (in[i_1] & 0xf) << 9 | (ushort)(in[i_1 - 2] >> 7) + (ushort)in[i_1 - 1] * 2;
    (ppVar4->field_0).v[4] =
         (in[i_1 + 2] & 1) << 0xc | (ushort)in[i_1 + 1] << 4 | (ushort)(in[i_1] >> 4);
    (ppVar4->field_0).v[5] = (in[i_1 + 3] & 0x3f) << 7 | (ushort)(in[i_1 + 2] >> 1);
    (ppVar4->field_0).v[6] =
         (in[i_1 + 5] & 7) << 10 | (ushort)(in[i_1 + 3] >> 6) + (ushort)in[i_1 + 4] * 4;
    (ppVar4->field_0).v[7] = (ushort)in[i_1 + 6] << 5 | (ushort)(in[i_1 + 5] >> 3);
    i_1 = i_1 + 0xd;
    ppVar1 = (poly *)((ppVar4->field_0).vectors + 1);
  } while (i_1 != 0x471);
  (((poly *)((ppVar4->field_0).vectors + 1))->field_0).v[0] =
       (in[0x46c] & 0x1f) << 8 | (ushort)in[0x46b];
  (ppVar4->field_0).v[9] = (in[0x46e] & 3) << 0xb | (ushort)(in[0x46c] >> 5) + (ushort)in[0x46d] * 8
  ;
  (ppVar4->field_0).v[10] = (in[0x46f] & 0x7f) << 6 | (ushort)(in[0x46e] >> 2);
  (ppVar4->field_0).v[0xb] =
       (in[0x471] & 0xf) << 9 | (ushort)(in[0x46f] >> 7) + (ushort)in[0x470] * 2;
  lVar5 = 0;
  do {
    (out->field_0).v[lVar5] = (uint16_t)((uint)(int)(short)((out->field_0).v[lVar5] << 3) >> 3);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 700);
  iVar3 = 0;
  if (in[0x471] < 0x10) {
    lVar5 = 0;
    sVar2 = 0;
    do {
      sVar2 = sVar2 + (out->field_0).v[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 700);
    (out->field_0).v[700] = -sVar2;
    *(undefined4 *)((long)&out->field_0 + 0x57a) = 0;
    (out->field_0).v[0x2bf] = 0;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int poly_unmarshal(struct poly *out, const uint8_t in[POLY_BYTES]) {
  uint16_t *p = out->v;

  for (size_t i = 0; i < N / 8; i++) {
    p[0] = (uint16_t)(in[0]) | (uint16_t)(in[1] & 0x1f) << 8;
    p[1] = (uint16_t)(in[1] >> 5) | (uint16_t)(in[2]) << 3 |
           (uint16_t)(in[3] & 3) << 11;
    p[2] = (uint16_t)(in[3] >> 2) | (uint16_t)(in[4] & 0x7f) << 6;
    p[3] = (uint16_t)(in[4] >> 7) | (uint16_t)(in[5]) << 1 |
           (uint16_t)(in[6] & 0xf) << 9;
    p[4] = (uint16_t)(in[6] >> 4) | (uint16_t)(in[7]) << 4 |
           (uint16_t)(in[8] & 1) << 12;
    p[5] = (uint16_t)(in[8] >> 1) | (uint16_t)(in[9] & 0x3f) << 7;
    p[6] = (uint16_t)(in[9] >> 6) | (uint16_t)(in[10]) << 2 |
           (uint16_t)(in[11] & 7) << 10;
    p[7] = (uint16_t)(in[11] >> 3) | (uint16_t)(in[12]) << 5;

    p += 8;
    in += 13;
  }

  // There are four coefficients remaining.
  p[0] = (uint16_t)(in[0]) | (uint16_t)(in[1] & 0x1f) << 8;
  p[1] = (uint16_t)(in[1] >> 5) | (uint16_t)(in[2]) << 3 |
         (uint16_t)(in[3] & 3) << 11;
  p[2] = (uint16_t)(in[3] >> 2) | (uint16_t)(in[4] & 0x7f) << 6;
  p[3] = (uint16_t)(in[4] >> 7) | (uint16_t)(in[5]) << 1 |
         (uint16_t)(in[6] & 0xf) << 9;

  for (unsigned i = 0; i < N - 1; i++) {
    out->v[i] = (int16_t)(out->v[i] << 3) >> 3;
  }

  // There are four unused bits in the last byte. We require them to be zero.
  if ((in[6] & 0xf0) != 0) {
    return 0;
  }

  // Set the final coefficient as specifed in [HRSSNIST] 1.9.2 step 6.
  uint32_t sum = 0;
  for (size_t i = 0; i < N - 1; i++) {
    sum += out->v[i];
  }

  out->v[N - 1] = (uint16_t)(0u - sum);
  poly_normalize(out);

  return 1;
}